

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satTruth.c
# Opt level: O3

int Tru_ManInsert(Tru_Man_t *p,word *pTruth)

{
  Vec_Set_t *pVVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint *puVar5;
  word **__ptr;
  word *pwVar6;
  byte bVar7;
  long lVar8;
  word wVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  
  lVar4 = (long)p->nWords;
  if (0 < lVar4) {
    lVar8 = 0;
    do {
      if (pTruth[lVar8] != 0) {
        lVar8 = 0;
        while (pTruth[lVar8] == 0xffffffffffffffff) {
          lVar8 = lVar8 + 1;
          if (lVar4 == lVar8) {
            return 1;
          }
        }
        p->nTableLookups = p->nTableLookups + 1;
        if (p->nTableSize * 2 < p->pMem->nEntries) {
          Tru_ManResize(p);
        }
        uVar10 = (uint)*pTruth & 1;
        if ((uVar10 != 0) && (iVar2 = p->nWords, 0 < (long)iVar2)) {
          lVar4 = 0;
          do {
            pTruth[lVar4] = ~pTruth[lVar4];
            lVar4 = lVar4 + 1;
          } while (iVar2 != lVar4);
        }
        puVar5 = (uint *)Tru_ManLookup(p,pTruth);
        if (*puVar5 == 0) {
          pVVar1 = p->pMem;
          iVar13 = p->nEntrySize + 1 >> 1;
          bVar7 = (byte)pVVar1->nPageSize;
          iVar2 = 1 << (bVar7 & 0x1f);
          if (iVar2 <= iVar13) {
            __assert_fail("nWords < (1 << p->nPageSize)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecSet.h"
                          ,0xd8,"int Vec_SetAppend(Vec_Set_t *, int *, int)");
          }
          pVVar1->nEntries = pVVar1->nEntries + 1;
          __ptr = pVVar1->pPages;
          iVar11 = pVVar1->iPage;
          pwVar6 = __ptr[iVar11];
          wVar9 = *pwVar6;
          if (iVar2 <= iVar13 + (int)wVar9) {
            uVar12 = (long)iVar11 + 1;
            pVVar1->iPage = (int)uVar12;
            if ((int)uVar12 == pVVar1->nPagesAlloc) {
              __ptr = (word **)realloc(__ptr,uVar12 * 0x10);
              pVVar1->pPages = __ptr;
              iVar2 = pVVar1->nPagesAlloc;
              memset(__ptr + iVar2,0,(long)iVar2 << 3);
              pVVar1->nPagesAlloc = iVar2 * 2;
              bVar7 = (byte)pVVar1->nPageSize;
              uVar12 = (ulong)(uint)pVVar1->iPage;
            }
            iVar11 = (int)uVar12;
            pwVar6 = __ptr[iVar11];
            if (pwVar6 == (word *)0x0) {
              pwVar6 = (word *)malloc((long)(1 << (bVar7 & 0x1f)) << 3);
              __ptr[iVar11] = pwVar6;
              pwVar6 = pVVar1->pPages[iVar11];
            }
            *pwVar6 = 2;
            pwVar6[1] = 0xffffffffffffffff;
            wVar9 = 2;
          }
          *pwVar6 = (long)iVar13 + wVar9;
          uVar3 = ((int)((long)iVar13 + wVar9) - iVar13) + (iVar11 << (bVar7 & 0x1f));
          *puVar5 = uVar3;
          if ((uVar3 & 1) != 0) {
            __assert_fail("(*pSpot & 1) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satTruth.c"
                          ,0xb0,"int Tru_ManInsert(Tru_Man_t *, word *)");
          }
          if (uVar3 == 0) {
            pwVar6 = (word *)0x0;
          }
          else {
            pVVar1 = p->pMem;
            pwVar6 = pVVar1->pPages[(int)uVar3 >> ((byte)pVVar1->nPageSize & 0x1f)] +
                     (int)(pVVar1->uPageMask & uVar3);
          }
          iVar2 = p->nWords;
          if (0 < (long)iVar2) {
            lVar4 = 0;
            do {
              pwVar6[lVar4 + 1] = pTruth[lVar4];
              lVar4 = lVar4 + 1;
            } while (iVar2 != lVar4);
          }
          *(uint *)pwVar6 = uVar3;
          *(uint *)((long)pwVar6 + 4) = 0;
        }
        if ((uVar10 != 0) && (iVar2 = p->nWords, 0 < (long)iVar2)) {
          lVar4 = 0;
          do {
            pTruth[lVar4] = ~pTruth[lVar4];
            lVar4 = lVar4 + 1;
          } while (iVar2 != lVar4);
        }
        return uVar10 ^ *puVar5;
      }
      lVar8 = lVar8 + 1;
    } while (lVar4 != lVar8);
  }
  return 0;
}

Assistant:

int Tru_ManInsert( Tru_Man_t * p, word * pTruth )
{
    int fCompl, * pSpot;
    if ( Tru_ManEqual0(pTruth, p->nWords) )
        return 0;
    if ( Tru_ManEqual1(pTruth, p->nWords) )
        return 1;
    p->nTableLookups++;
    if ( Vec_SetEntryNum(p->pMem) > 2 * p->nTableSize )
        Tru_ManResize( p );
    fCompl = pTruth[0] & 1;
    if ( fCompl )  
        Tru_ManNot( pTruth, p->nWords );
    pSpot = Tru_ManLookup( p, pTruth );
    if ( *pSpot == 0 )
    {
        Tru_One_t * pEntry;
        *pSpot = Vec_SetAppend( p->pMem, NULL, p->nEntrySize );
        assert( (*pSpot & 1) == 0 );
        pEntry = Tru_ManReadOne( p, *pSpot );
        Tru_ManCopy( pEntry->pTruth, pTruth, p->nWords );
        pEntry->Handle = *pSpot;
        pEntry->Next = 0;
    }
    if ( fCompl )  
        Tru_ManNot( pTruth, p->nWords );
    return *pSpot ^ fCompl;
}